

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedColorMasks.cpp
# Opt level: O3

IterateResult __thiscall
glcts::DrawBuffersIndexedColorMasks::iterate(DrawBuffersIndexedColorMasks *this)

{
  RenderContext *pRVar1;
  TestLog *pTVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  uint7 uVar7;
  ConstPixelBufferAccess *pCVar8;
  ulong uVar9;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  char *description;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  IterateResult IVar13;
  ulong uVar14;
  qpTestResult testResult;
  DrawBuffersIndexedColorMasks *pDVar15;
  uint uVar16;
  DrawBuffersIndexedColorMasks *this_00;
  int iVar17;
  GLint maxDrawBuffers;
  GLboolean mask [4];
  GLuint tex;
  TextureLevel textureLevel;
  BlendMaskStateMachine state;
  int local_2c4;
  uint local_2c0;
  GLboolean local_2bc [4];
  undefined4 local_2b8;
  uint local_2b4;
  void *local_2b0;
  uint local_2a8 [4];
  long local_298;
  DrawBuffersIndexedColorMasks *local_290;
  RGBA local_284;
  string local_280;
  string local_260;
  ulong local_240;
  ulong local_238;
  GLenum local_230;
  undefined4 local_22c;
  TextureLevel local_228;
  undefined1 local_200 [40];
  undefined1 local_1d8 [8];
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [4];
  ios_base local_160 [264];
  ConstPixelBufferAccess local_58;
  long lVar6;
  
  iVar5 = (*((this->super_DrawBuffersIndexedBase).super_TestCaseBase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar5);
  uVar10 = iterate::WriteMasksFormats[iterate::formatId];
  prepareFramebuffer(this);
  local_2c4 = 0;
  (**(code **)(lVar6 + 0x868))(0x8824,&local_2c4);
  if (local_2c4 < 4) {
    tcu::TestContext::setTestResult
              ((this->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.super_TestNode
               .m_testCtx,QP_TEST_RESULT_FAIL,"Minimum number of draw buffers too low");
    return STOP;
  }
  (**(code **)(lVar6 + 0x6f8))(1,&local_22c);
  (**(code **)(lVar6 + 0xb8))(0x8c1a,local_22c);
  pDVar15 = (DrawBuffersIndexedColorMasks *)0x8c1a;
  local_240 = (ulong)uVar10;
  (**(code **)(lVar6 + 0x1398))(0x8c1a,1,(ulong)uVar10,0x20,0x20,local_2c4);
  if (0 < local_2c4) {
    iVar5 = 0;
    do {
      pDVar15 = (DrawBuffersIndexedColorMasks *)0x8d40;
      (**(code **)(lVar6 + 0x6b8))(0x8d40,iVar5 + 0x8ce0,local_22c,0,iVar5);
      iVar5 = iVar5 + 1;
    } while (iVar5 < local_2c4);
  }
  iVar5 = local_2c4;
  local_298 = lVar6;
  local_230 = ReadableType(pDVar15,(GLenum)local_240);
  lVar6 = local_298;
  local_290 = this;
  if (local_230 == 0x1401) {
    local_1d8 = (undefined1  [8])0x3e99999a3e19999a;
    uStack_1d0 = 0x3ee66666;
    uStack_1cc = 0x3f19999a;
    if (0 < iVar5) {
      iVar17 = 0;
      do {
        (**(code **)(lVar6 + 0x1a8))(0x1800,iVar17,local_1d8);
        iVar17 = iVar17 + 1;
        iVar5 = local_2c4;
      } while (iVar17 < local_2c4);
    }
  }
  else if (local_230 == 0x1404) {
    local_1d8 = (undefined1  [8])0x300000002;
    uStack_1d0 = 4;
    uStack_1cc = 5;
    if (0 < iVar5) {
      iVar17 = 0;
      do {
        (**(code **)(lVar6 + 0x1b0))(0x1800,iVar17,local_1d8);
        iVar17 = iVar17 + 1;
        iVar5 = local_2c4;
      } while (iVar17 < local_2c4);
    }
  }
  else if (local_230 == 0x1405) {
    local_1d8 = (undefined1  [8])0x300000002;
    uStack_1d0 = 4;
    uStack_1cc = 5;
    if (0 < iVar5) {
      iVar17 = 0;
      do {
        (**(code **)(lVar6 + 0x1b8))(0x1800,iVar17,local_1d8);
        iVar17 = iVar17 + 1;
        iVar5 = local_2c4;
      } while (iVar17 < local_2c4);
    }
  }
  this_00 = local_290;
  pDVar15 = (DrawBuffersIndexedColorMasks *)local_200;
  DrawBuffersIndexedBase::BlendMaskStateMachine::BlendMaskStateMachine
            ((BlendMaskStateMachine *)pDVar15,
             (local_290->super_DrawBuffersIndexedBase).super_TestCaseBase.m_context,
             ((local_290->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
              super_TestNode.m_testCtx)->m_log,iVar5);
  local_2bc[0] = '\0';
  local_2bc[1] = '\0';
  local_2bc[2] = '\0';
  local_2bc[3] = '\0';
  bVar4 = false;
  uVar10 = 0;
  if (0 < local_2c4) {
    do {
      local_2bc[uVar10 & 3] = '\x01';
      pDVar15 = (DrawBuffersIndexedColorMasks *)local_200;
      DrawBuffersIndexedBase::BlendMaskStateMachine::SetColorMaski
                ((BlendMaskStateMachine *)local_200,uVar10,local_2bc[0],local_2bc[1],local_2bc[2],
                 local_2bc[3]);
      local_2bc[uVar10 & 3] = '\0';
      uVar10 = uVar10 + 1;
    } while ((int)uVar10 < local_2c4);
    bVar4 = 0 < local_2c4;
  }
  if (local_230 == 0x1401) {
    local_1d8 = (undefined1  [8])0x3f59999a3f59999a;
    uStack_1d0 = 0x3f59999a;
    uStack_1cc = 0x3f59999a;
    if (bVar4) {
      iVar5 = 0;
      do {
        pDVar15 = (DrawBuffersIndexedColorMasks *)0x1800;
        (**(code **)(local_298 + 0x1a8))(0x1800,iVar5,local_1d8);
        iVar5 = iVar5 + 1;
      } while (iVar5 < local_2c4);
    }
  }
  else if (local_230 == 0x1404) {
    local_1d8 = (undefined1  [8])0x1700000017;
    uStack_1d0 = 0x17;
    uStack_1cc = 0x17;
    if (bVar4) {
      iVar5 = 0;
      do {
        pDVar15 = (DrawBuffersIndexedColorMasks *)0x1800;
        (**(code **)(local_298 + 0x1b0))(0x1800,iVar5,local_1d8);
        iVar5 = iVar5 + 1;
      } while (iVar5 < local_2c4);
    }
  }
  else if (local_230 == 0x1405) {
    local_1d8 = (undefined1  [8])0x1700000017;
    uStack_1d0 = 0x17;
    uStack_1cc = 0x17;
    if (bVar4) {
      iVar5 = 0;
      do {
        pDVar15 = (DrawBuffersIndexedColorMasks *)0x1800;
        (**(code **)(local_298 + 0x1b8))(0x1800,iVar5,local_1d8);
        iVar5 = iVar5 + 1;
      } while (iVar5 < local_2c4);
    }
  }
  local_2c0 = NumComponents(pDVar15,(GLenum)local_240);
  local_284 = GetEpsilon(this_00);
  uVar7 = (uint7)(uint3)(local_284.m_value >> 8);
  if (local_2c4 < 1) {
    local_2b8 = (undefined4)CONCAT71(uVar7,1);
  }
  else {
    local_2b8 = (undefined4)CONCAT71(uVar7,1);
    uVar14 = 0x8ce0;
    do {
      (**(code **)(local_298 + 0x1218))(uVar14);
      uVar10 = (int)uVar14 - 0x8ce0;
      if (local_230 == 0x1401) {
        uVar11 = 0;
        local_2a8[0] = 0x26;
        local_2a8[1] = 0x4c;
        local_2a8[2] = 0x72;
        local_2a8[3] = 0x99;
        local_2a8[uVar10 & 3] = 0xd8;
        uVar12 = 0xff000000;
        if (local_2c0 < 2) {
          uVar16 = 0;
        }
        else {
          uVar16 = local_2a8[1];
          uVar11 = 0;
          if (local_2c0 != 2) {
            uVar12 = local_2a8[3] << 0x18;
            if (local_2c0 != 4) {
              uVar12 = 0xff000000;
            }
            uVar11 = local_2a8[2] << 0x10;
          }
        }
        uVar3 = local_2a8[0];
        local_2a8[1] = uVar16;
        local_2b4 = uVar10;
        local_238 = uVar14;
        local_2b0 = operator_new(0x1000);
        memset(local_2b0,0x2d,0x1000);
        local_1d8 = (undefined1  [8])0x300000008;
        tcu::TextureLevel::TextureLevel(&local_228,(TextureFormat *)local_1d8,0x20,0x20,1);
        pRVar1 = ((local_290->super_DrawBuffersIndexedBase).super_TestCaseBase.m_context)->
                 m_renderCtx;
        tcu::TextureLevel::getAccess((PixelBufferAccess *)local_1d8,&local_228);
        glu::readPixels(pRVar1,0,0,(PixelBufferAccess *)local_1d8);
        this_00 = local_290;
        bVar4 = VerifyImg(local_290,&local_228,(RGBA)(uVar11 | uVar16 << 8 | uVar12 | uVar3),
                          local_284);
        if (!bVar4) {
          local_1d8 = (undefined1  [8])
                      ((this_00->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                       super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&uStack_1d0,"Write mask error in texture format ",0x23);
          std::ostream::_M_insert<unsigned_long>((ulong)&uStack_1d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&uStack_1d0," occurred for buffer #",0x16);
          std::ostream::operator<<((ostringstream *)&uStack_1d0,local_2b4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1d0,"\n",1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1d0);
          std::ios_base::~ios_base(local_160);
          pTVar2 = ((this_00->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                    super_TestNode.m_testCtx)->m_log;
          local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"Result","");
          local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_280,"Rendered result image","");
          pCVar8 = &local_58;
          tcu::TextureLevel::getAccess((PixelBufferAccess *)pCVar8,&local_228);
          tcu::LogImage::LogImage
                    ((LogImage *)local_1d8,&local_260,&local_280,pCVar8,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write((LogImage *)local_1d8,(int)pTVar2,__buf,(size_t)pCVar8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8[1]._0_8_ != local_1a8) {
            operator_delete((void *)local_1c8[1]._0_8_,local_1a8[0]._M_allocated_capacity + 1);
          }
          if (local_1d8 != (undefined1  [8])local_1c8) {
            operator_delete((void *)local_1d8,local_1c8[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280._M_dataplus._M_p != &local_280.field_2) {
            operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_dataplus._M_p != &local_260.field_2) {
            operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
          }
          local_2b8 = 0;
        }
        tcu::TextureLevel::~TextureLevel(&local_228);
        operator_delete(local_2b0,0x1000);
        uVar9 = local_238;
      }
      else {
        if (local_230 == 0x1404) {
          uVar12 = 0;
          local_2a8[0] = 2;
          local_2a8[1] = 3;
          local_2a8[2] = 4;
          local_2a8[3] = 5;
          local_2a8[uVar10 & 3] = 0x17;
          if (local_2c0 < 2) {
            local_2b0 = (void *)CONCAT44(local_2b0._4_4_,0x1000000);
            uVar11 = 0;
          }
          else {
            uVar11 = local_2a8[1];
            if (local_2c0 == 2) {
              local_2b0 = (void *)CONCAT44(local_2b0._4_4_,0x1000000);
              uVar12 = 0;
            }
            else {
              iVar5 = local_2a8[3] << 0x18;
              if (local_2c0 != 4) {
                iVar5 = 0x1000000;
              }
              local_2b0 = (void *)CONCAT44(local_2b0._4_4_,iVar5);
              uVar12 = local_2a8[2] << 0x10;
            }
          }
          uVar16 = local_2a8[0];
          local_2a8[1] = uVar11;
          local_1d8 = (undefined1  [8])0x1d00000008;
          local_2b4 = uVar10;
          local_238 = uVar14;
          tcu::TextureLevel::TextureLevel(&local_228,(TextureFormat *)local_1d8,0x20,0x20,1);
          pRVar1 = ((this_00->super_DrawBuffersIndexedBase).super_TestCaseBase.m_context)->
                   m_renderCtx;
          tcu::TextureLevel::getAccess((PixelBufferAccess *)local_1d8,&local_228);
          glu::readPixels(pRVar1,0,0,(PixelBufferAccess *)local_1d8);
          this_00 = local_290;
          bVar4 = VerifyImg(local_290,&local_228,
                            (RGBA)(uVar12 | uVar11 << 8 | (uint)local_2b0 | uVar16),local_284);
          if (!bVar4) {
            local_1d8 = (undefined1  [8])
                        ((this_00->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                         super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1d0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&uStack_1d0,"Write mask error in texture format ",0x23);
            std::ostream::_M_insert<unsigned_long>((ulong)&uStack_1d0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&uStack_1d0," occurred for buffer #",0x16);
            std::ostream::operator<<((ostringstream *)&uStack_1d0,local_2b4);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1d0,"\n",1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1d0);
            std::ios_base::~ios_base(local_160);
            pTVar2 = ((this_00->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                      super_TestNode.m_testCtx)->m_log;
            local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"Result","");
            local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_280,"Rendered result image","");
            pCVar8 = &local_58;
            tcu::TextureLevel::getAccess((PixelBufferAccess *)pCVar8,&local_228);
            tcu::LogImage::LogImage
                      ((LogImage *)local_1d8,&local_260,&local_280,pCVar8,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
            tcu::LogImage::write((LogImage *)local_1d8,(int)pTVar2,__buf_00,(size_t)pCVar8);
LAB_00ce952c:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8[1]._0_8_ != local_1a8) {
              operator_delete((void *)local_1c8[1]._0_8_,local_1a8[0]._M_allocated_capacity + 1);
            }
            if (local_1d8 != (undefined1  [8])local_1c8) {
              operator_delete((void *)local_1d8,local_1c8[0]._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_280._M_dataplus._M_p != &local_280.field_2) {
              operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p != &local_260.field_2) {
              operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1
                             );
            }
            local_2b8 = 0;
          }
        }
        else {
          uVar9 = uVar14;
          if (local_230 != 0x1405) goto LAB_00ce95c6;
          uVar12 = 0;
          local_2a8[0] = 2;
          local_2a8[1] = 3;
          local_2a8[2] = 4;
          local_2a8[3] = 5;
          local_2a8[uVar10 & 3] = 0x17;
          if (local_2c0 < 2) {
            local_2b0 = (void *)CONCAT44(local_2b0._4_4_,0x1000000);
            uVar11 = 0;
          }
          else {
            uVar11 = local_2a8[1];
            if (local_2c0 == 2) {
              local_2b0 = (void *)CONCAT44(local_2b0._4_4_,0x1000000);
              uVar12 = 0;
            }
            else {
              iVar5 = local_2a8[3] << 0x18;
              if (local_2c0 != 4) {
                iVar5 = 0x1000000;
              }
              local_2b0 = (void *)CONCAT44(local_2b0._4_4_,iVar5);
              uVar12 = local_2a8[2] << 0x10;
            }
          }
          uVar16 = local_2a8[0];
          local_2a8[1] = uVar11;
          local_1d8 = (undefined1  [8])0x2100000008;
          local_2b4 = uVar10;
          local_238 = uVar14;
          tcu::TextureLevel::TextureLevel(&local_228,(TextureFormat *)local_1d8,0x20,0x20,1);
          pRVar1 = ((this_00->super_DrawBuffersIndexedBase).super_TestCaseBase.m_context)->
                   m_renderCtx;
          tcu::TextureLevel::getAccess((PixelBufferAccess *)local_1d8,&local_228);
          glu::readPixels(pRVar1,0,0,(PixelBufferAccess *)local_1d8);
          this_00 = local_290;
          bVar4 = VerifyImg(local_290,&local_228,
                            (RGBA)(uVar12 | uVar11 << 8 | (uint)local_2b0 | uVar16),local_284);
          if (!bVar4) {
            local_1d8 = (undefined1  [8])
                        ((this_00->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                         super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1d0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&uStack_1d0,"Write mask error in texture format ",0x23);
            std::ostream::_M_insert<unsigned_long>((ulong)&uStack_1d0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&uStack_1d0," occurred for buffer #",0x16);
            std::ostream::operator<<((ostringstream *)&uStack_1d0,local_2b4);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1d0,"\n",1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1d0);
            std::ios_base::~ios_base(local_160);
            pTVar2 = ((this_00->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                      super_TestNode.m_testCtx)->m_log;
            local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"Result","");
            local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_280,"Rendered result image","");
            pCVar8 = &local_58;
            tcu::TextureLevel::getAccess((PixelBufferAccess *)pCVar8,&local_228);
            tcu::LogImage::LogImage
                      ((LogImage *)local_1d8,&local_260,&local_280,pCVar8,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
            tcu::LogImage::write((LogImage *)local_1d8,(int)pTVar2,__buf_01,(size_t)pCVar8);
            goto LAB_00ce952c;
          }
        }
        tcu::TextureLevel::~TextureLevel(&local_228);
        uVar9 = local_238;
      }
LAB_00ce95c6:
      uVar14 = (ulong)((int)uVar9 + 1);
    } while ((int)uVar9 + -0x8cdf < local_2c4);
  }
  lVar6 = local_298;
  (**(code **)(local_298 + 0x238))(1,1,1,1);
  (**(code **)(lVar6 + 0xb8))(0x8c1a,0);
  (**(code **)(lVar6 + 0x480))(1,&local_22c);
  releaseFramebuffer(this_00);
  iVar5 = (**(code **)(lVar6 + 0x800))();
  description = "Some functions generated error";
  if (iVar5 == 0) {
    description = "Write mask error occurred";
  }
  testResult = QP_TEST_RESULT_FAIL;
  if (((byte)local_2b8 & iVar5 == 0) != 0) {
    iterate::formatId = iterate::formatId + 1;
    IVar13 = CONTINUE;
    if (iterate::formatId < 0x19) goto LAB_00ce9689;
    description = "Pass";
    testResult = QP_TEST_RESULT_PASS;
  }
  tcu::TestContext::setTestResult
            ((this_00->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
             super_TestNode.m_testCtx,testResult,description);
  iterate::formatId = 0;
  IVar13 = STOP;
LAB_00ce9689:
  if ((_func_int **)local_200._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_200._0_8_,local_200._16_8_ - local_200._0_8_);
  }
  return IVar13;
}

Assistant:

tcu::TestNode::IterateResult DrawBuffersIndexedColorMasks::iterate()
{
	static const glw::GLenum WriteMasksFormats[] = { GL_R8,		 GL_RG8,	 GL_RGB8,	 GL_RGB565,  GL_RGBA4,
													 GL_RGB5_A1, GL_RGBA8,   GL_R8I,	  GL_R8UI,	GL_R16I,
													 GL_R16UI,   GL_R32I,	GL_R32UI,	GL_RG8I,	GL_RG8UI,
													 GL_RG16I,   GL_RG16UI,  GL_RG32I,	GL_RG32UI,  GL_RGBA8I,
													 GL_RGBA8UI, GL_RGBA16I, GL_RGBA16UI, GL_RGBA32I, GL_RGBA32UI };
	static const int	kSize	= 32;
	static unsigned int formatId = 0;

	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	glw::GLenum			  format = WriteMasksFormats[formatId];

	prepareFramebuffer();

	// Check number of available draw buffers
	glw::GLint maxDrawBuffers = 0;
	gl.getIntegerv(GL_MAX_DRAW_BUFFERS, &maxDrawBuffers);
	if (maxDrawBuffers < 4)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Minimum number of draw buffers too low");
		return STOP;
	}

	// Prepare render targets
	glw::GLuint tex;
	gl.genTextures(1, &tex);
	gl.bindTexture(GL_TEXTURE_2D_ARRAY, tex);
	gl.texStorage3D(GL_TEXTURE_2D_ARRAY, 1, format, kSize, kSize, maxDrawBuffers);
	for (int i = 0; i < maxDrawBuffers; ++i)
	{
		gl.framebufferTextureLayer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0 + i, tex, 0, i);
	}

	// Clear all buffers
	switch (ReadableType(format))
	{
	case GL_UNSIGNED_BYTE:
	{
		tcu::Vec4 c0(0.15f, 0.3f, 0.45f, 0.6f);
		for (int i = 0; i < maxDrawBuffers; ++i)
		{
			gl.clearBufferfv(GL_COLOR, i, &c0[0]);
		}
		break;
	}
	case GL_UNSIGNED_INT:
	{
		tcu::UVec4 c0(2, 3, 4, 5);
		for (int i = 0; i < maxDrawBuffers; ++i)
		{
			gl.clearBufferuiv(GL_COLOR, i, &c0[0]);
		}
		break;
	}
	case GL_INT:
	{
		tcu::IVec4 c0(2, 3, 4, 5);
		for (int i = 0; i < maxDrawBuffers; ++i)
		{
			gl.clearBufferiv(GL_COLOR, i, &c0[0]);
		}
		break;
	}
	}

	// Set color masks for each buffer
	BlendMaskStateMachine state(m_context, m_testCtx.getLog(), maxDrawBuffers);

	glw::GLboolean mask[] = { GL_FALSE, GL_FALSE, GL_FALSE, GL_FALSE };
	for (int i = 0; i < maxDrawBuffers; ++i)
	{
		mask[i % 4] = GL_TRUE;
		state.SetColorMaski(i, mask[0], mask[1], mask[2], mask[3]);
		mask[i % 4] = GL_FALSE;
	}

	// Clear all buffers
	switch (ReadableType(format))
	{
	case GL_UNSIGNED_BYTE:
	{
		tcu::Vec4 c1(0.85f, 0.85f, 0.85f, 0.85f);
		for (int i = 0; i < maxDrawBuffers; ++i)
		{
			gl.clearBufferfv(GL_COLOR, i, &c1[0]);
		}
		break;
	}
	case GL_UNSIGNED_INT:
	{
		tcu::UVec4 c1(23, 23, 23, 23);
		for (int i = 0; i < maxDrawBuffers; ++i)
		{
			gl.clearBufferuiv(GL_COLOR, i, &c1[0]);
		}
		break;
	}
	case GL_INT:
	{
		tcu::IVec4 c1(23, 23, 23, 23);
		for (int i = 0; i < maxDrawBuffers; ++i)
		{
			gl.clearBufferiv(GL_COLOR, i, &c1[0]);
		}
		break;
	}
	}

	// Verify color
	int		  numComponents = NumComponents(format);
	tcu::RGBA epsilon		= GetEpsilon();
	bool	  success		= true;

	for (int i = 0; i < maxDrawBuffers; ++i)
	{
		gl.readBuffer(GL_COLOR_ATTACHMENT0 + i);

		switch (ReadableType(format))
		{
		case GL_UNSIGNED_BYTE:
		{
			tcu::UVec4 e(static_cast<unsigned int>(0.15f * 255), static_cast<unsigned int>(0.30f * 255),
						 static_cast<unsigned int>(0.45f * 255), static_cast<unsigned int>(0.60f * 255));
			e[i % 4] = static_cast<unsigned int>(0.85f * 255);
			e		 = tcu::UVec4(e.x(), numComponents >= 2 ? e.y() : 0, numComponents >= 3 ? e.z() : 0,
						   numComponents == 4 ? e.w() : 255);
			tcu::RGBA expected(e.x(), e.y(), e.z(), e.w());

			std::vector<unsigned char> rendered(kSize * kSize * 4, 45);

			tcu::TextureLevel textureLevel(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8),
										   kSize, kSize);
			glu::readPixels(m_context.getRenderContext(), 0, 0, textureLevel.getAccess());

			if (!VerifyImg(textureLevel, expected, epsilon))
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Write mask error in texture format " << format
								   << " occurred for buffer #" << i << "\n"
								   << tcu::TestLog::EndMessage;
				m_testCtx.getLog() << tcu::TestLog::Image("Result", "Rendered result image", textureLevel.getAccess());
				success = false;
			}
			break;
		}
		case GL_UNSIGNED_INT:
		{
			tcu::UVec4 e(2, 3, 4, 5);
			e[i % 4] = 23;
			e		 = tcu::UVec4(e.x(), numComponents >= 2 ? e.y() : 0, numComponents >= 3 ? e.z() : 0,
						   numComponents == 4 ? e.w() : 1);
			tcu::RGBA expected(e.x(), e.y(), e.z(), e.w());

			tcu::TextureLevel textureLevel(
				tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNSIGNED_INT32), kSize, kSize);
			glu::readPixels(m_context.getRenderContext(), 0, 0, textureLevel.getAccess());

			if (!VerifyImg(textureLevel, expected, epsilon))
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Write mask error in texture format " << format
								   << " occurred for buffer #" << i << "\n"
								   << tcu::TestLog::EndMessage;
				m_testCtx.getLog() << tcu::TestLog::Image("Result", "Rendered result image", textureLevel.getAccess());
				success = false;
			}
			break;
		}
		case GL_INT:
		{
			tcu::UVec4 e(2, 3, 4, 5);
			e[i % 4] = 23;
			e		 = tcu::UVec4(e.x(), numComponents >= 2 ? e.y() : 0, numComponents >= 3 ? e.z() : 0,
						   numComponents == 4 ? e.w() : 1);
			tcu::RGBA expected(e.x(), e.y(), e.z(), e.w());

			tcu::TextureLevel textureLevel(
				tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::SIGNED_INT32), kSize, kSize);
			glu::readPixels(m_context.getRenderContext(), 0, 0, textureLevel.getAccess());

			if (!VerifyImg(textureLevel, expected, epsilon))
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Write mask error in texture format " << format
								   << " occurred for buffer #" << i << "\n"
								   << tcu::TestLog::EndMessage;
				m_testCtx.getLog() << tcu::TestLog::Image("Result", "Rendered result image", textureLevel.getAccess());
				success = false;
			}
			break;
		}
		}
	}

	gl.colorMask(GL_TRUE, GL_TRUE, GL_TRUE, GL_TRUE);
	gl.bindTexture(GL_TEXTURE_2D_ARRAY, 0);
	gl.deleteTextures(1, &tex);
	releaseFramebuffer();

	// Check for error
	glw::GLenum error_code = gl.getError();
	if (error_code != GL_NO_ERROR)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Some functions generated error");
		formatId = 0;
		return STOP;
	}

	if (!success)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Write mask error occurred");
		formatId = 0;
		return STOP;
	}
	else
	{
		++formatId;
		if (formatId < (sizeof(WriteMasksFormats) / sizeof(WriteMasksFormats[0])))
		{
			return CONTINUE;
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
			formatId = 0;
			return STOP;
		}
	}
}